

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O2

void Col_MListSetLength(Col_Word mlist,size_t length)

{
  uint uVar1;
  size_t index;
  size_t sVar2;
  Col_Word CVar3;
  ulong uVar4;
  byte *mvector;
  Col_Word root;
  byte *local_28;
  
  mvector = *(byte **)(mlist + 0x10);
  local_28 = mvector;
  if (length == 0) {
    if (mvector != (byte *)0x0) {
      if (((ulong)mvector & 0xf) == 0) {
        if ((*mvector & 2) == 0) goto LAB_0010f4a5;
        uVar1 = *mvector & 0xfffffffe;
      }
      else {
        uVar1 = immediateWordTypes[(uint)mvector & 0x1f];
      }
      if (uVar1 == 0x1a) {
        Col_MVectorSetLength((Col_Word)mvector,0);
        return;
      }
    }
LAB_0010f4a5:
    *(undefined8 *)(mlist + 0x10) = 0x14;
    return;
  }
  index = Col_ListLength(mlist);
  sVar2 = Col_ListLoopLength(mlist);
  uVar4 = index - sVar2;
  if (uVar4 == 0 && sVar2 != 0) {
    if (index < length) {
      CVar3 = Col_Sublist((Col_Word)mvector,0,length - 1);
      *(Col_Word *)(mlist + 0x10) = CVar3;
      return;
    }
    *(ulong *)(mlist + 0x10) = (ulong)mvector & 0xfffffffffffffff7;
LAB_0010f46a:
    Col_MListSetLength(mlist,length);
    return;
  }
  if (sVar2 == 0) {
    if (index <= length && length - index != 0) {
      CVar3 = Col_NewList(length - index,(Col_Word *)0x0);
      Col_MListInsert(mlist,index,CVar3);
      return;
    }
    if (index <= length) {
      return;
    }
    Col_MListRemove(mlist,length,index - 1);
    return;
  }
  if (length < uVar4 || length - uVar4 == 0) {
    *(undefined8 *)(mlist + 0x10) = *(undefined8 *)(mvector + 0x10);
    goto LAB_0010f46a;
  }
  if (mvector != (byte *)0x0) {
    if (((ulong)mvector & 0xf) == 0) {
      if ((*mvector & 2) == 0) goto LAB_0010f4dd;
      uVar1 = *mvector & 0xfffffffe;
    }
    else {
      uVar1 = immediateWordTypes[(uint)mvector & 0x1f];
    }
    if (uVar1 == 0x26) goto LAB_0010f4eb;
  }
LAB_0010f4dd:
  ConvertToMConcatNode((Col_Word *)&local_28);
  mvector = local_28;
LAB_0010f4eb:
  *(undefined8 *)(mlist + 0x10) = *(undefined8 *)(mvector + 0x18);
  Col_MListSetLength(mlist,length - uVar4);
  *(undefined8 *)(mvector + 0x18) = *(undefined8 *)(mlist + 0x10);
  UpdateMConcatNode((Col_Word)mvector);
  *(byte **)(mlist + 0x10) = mvector;
  return;
}

Assistant:

void
Col_MListSetLength(
    Col_Word mlist, /*!< Mutable list to resize. */
    size_t length)  /*!< New length. */
{
    size_t listLength, listLoop;
    Col_Word root;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    root = WORD_WRAP_SOURCE(mlist);

    if (length == 0) {
        /*
         * Empty list.
         */


        switch (WORD_TYPE(root)) {
        case WORD_TYPE_MVECTOR:
            /*
             * Shrink mutable vector so as to preserve its capacity should the
             * list length grow in the future.
             */

            Col_MVectorSetLength(root, 0);
            break;

        default:
            WORD_WRAP_SOURCE(mlist) = WORD_LIST_EMPTY;
        }
        return;
    }

    listLength = Col_ListLength(mlist);
    listLoop = Col_ListLoopLength(mlist);
    if (listLoop && listLoop == listLength) {
        /*
         * List is circular.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CIRCLIST);
        if (length <= listLength) {
            /*
             * Shorten loop.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_CORE(root);
            Col_MListSetLength(mlist, length);
        } else {
            /*
             * Sublist of circular list.
             */

            WORD_WRAP_SOURCE(mlist) = Col_Sublist(root, 0, length-1);
        }
        return;
    } else if (listLoop) {
        /*
         * List is cyclic.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CONCATLIST || WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
        ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

        if (length <= listLength-listLoop) {
            /*
             * Keep head.
             */

            ASSERT(listLoop < listLength);
            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_LEFT(root);
            ASSERT(Col_ListLength(mlist) >= length);
            Col_MListSetLength(mlist, length);
        } else {
            /*
             * Shorten tail. Temporarily use tail as root before recursive call.
             */

            if (WORD_TYPE(root) != WORD_TYPE_MCONCATLIST) {
                ConvertToMConcatNode(&root);
            }
            ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            Col_MListSetLength(mlist, length - (listLength-listLoop));
            WORD_CONCATLIST_RIGHT(root) = WORD_WRAP_SOURCE(mlist);
            UpdateMConcatNode(root);
            WORD_WRAP_SOURCE(mlist) = root;
        }
        return;
    }

    /*
     * Acyclic list.
     */

    if (listLength < length) {
        /*
         * Append void list.
         */

        Col_MListInsert(mlist, listLength, Col_NewList(length - listLength,
                NULL));
    } else if (listLength > length) {
        /*
         * Remove tail.
         */

        Col_MListRemove(mlist, length, listLength-1);
    }
}